

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double benchmark_processing<eumorphic::collection<container,A,B,C,D,CA,CB>>(size_t num_elems)

{
  result_type_conflict1 rVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double duration;
  double t;
  time_point start;
  uniform_real_distribution<double> rnd_value;
  uniform_int_distribution<int> rnd_type;
  mt19937_64 gen;
  undefined1 local_1428 [8];
  random_device rd;
  collection<container,_A,_B,_C,_D,_CA,_CB> container;
  size_t num_elems_local;
  
  eumorphic::collection<container,_A,_B,_C,_D,_CA,_CB>::collection
            ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380));
  std::random_device::random_device((random_device *)local_1428);
  rVar1 = std::random_device::operator()((random_device *)local_1428);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&rnd_type,(ulong)rVar1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&rnd_value._M_param._M_b,0,5);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&start,0.0,100000.0);
  random_fill<eumorphic::collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
            ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380),
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&rnd_type,(uniform_int_distribution<int> *)&rnd_value._M_param._M_b,
             (uniform_real_distribution<double> *)&start,num_elems);
  t = (double)tic();
  process<container,_A,_B,_C,_D,_CA,_CB>
            ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380));
  dVar3 = toc((time_point *)&t);
  sVar2 = eumorphic::collection<container,_A,_B,_C,_D,_CA,_CB>::size
                    ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380));
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  do_not_optimize_out<container,_A,_B,_C,_D,_CA,_CB>
            ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380));
  std::random_device::~random_device((random_device *)local_1428);
  eumorphic::collection<container,_A,_B,_C,_D,_CA,_CB>::~collection
            ((collection<container,_A,_B,_C,_D,_CA,_CB> *)((long)&rd.field_0 + 0x1380));
  return dVar3 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
}

Assistant:

double benchmark_processing( std::size_t num_elems)
{
	Cont container;

        //std::cout << "p";
        std::random_device rd;
        std::mt19937_64					gen(rd());
	std::uniform_int_distribution<>			rnd_type(0, 5 );
	std::uniform_real_distribution<double>	rnd_value(0, 100000);
	random_fill(container, gen, rnd_type, rnd_value, num_elems);

	auto start = tic();
	{
		process(container);
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}